

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake3.c
# Opt level: O0

void blake3_hasher_init_keyed(blake3_hasher *self,uint8_t *key)

{
  undefined8 uVar1;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  uint32_t key_words [8];
  uint8_t *p_7;
  uint8_t *p_6;
  uint8_t *p_5;
  uint8_t *p_4;
  uint8_t *p_3;
  uint8_t *p_2;
  uint8_t *p_1;
  uint8_t *p;
  undefined4 local_f8 [2];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined1 local_b9;
  undefined1 *local_b8;
  undefined8 *local_b0;
  undefined1 *local_a8;
  undefined1 local_91;
  undefined1 *local_90;
  undefined8 *local_88;
  undefined4 *local_80;
  undefined4 *local_78;
  undefined8 *local_70;
  undefined8 *local_68;
  undefined4 *local_60;
  undefined4 *local_58;
  undefined8 *local_50;
  undefined8 *local_48;
  undefined4 *local_40;
  undefined4 *local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  undefined4 *local_20;
  undefined4 *local_18;
  
  local_a8 = (undefined1 *)local_f8;
  local_b8 = (undefined1 *)local_f8;
  local_90 = (undefined1 *)local_f8;
  local_f8[0] = *(undefined4 *)in_RSI;
  local_20 = (undefined4 *)((long)in_RSI + 4);
  uVar1 = *in_RSI;
  local_30 = in_RSI + 1;
  local_f0._0_4_ = *(undefined4 *)local_30;
  local_40 = (undefined4 *)((long)in_RSI + 0xc);
  local_f0._4_4_ = *local_40;
  local_50 = in_RSI + 2;
  local_e8._0_4_ = *(undefined4 *)local_50;
  local_60 = (undefined4 *)((long)in_RSI + 0x14);
  local_e8._4_4_ = *local_60;
  local_70 = in_RSI + 3;
  local_e0._0_4_ = *(undefined4 *)local_70;
  local_80 = (undefined4 *)((long)in_RSI + 0x1c);
  local_e0._4_4_ = *local_80;
  local_b9 = 0x10;
  *in_RDI = *in_RSI;
  in_RDI[1] = local_f0;
  in_RDI[2] = local_e8;
  in_RDI[3] = local_e0;
  local_88 = in_RDI + 4;
  local_91 = 0x10;
  *local_88 = uVar1;
  in_RDI[5] = local_f0;
  in_RDI[6] = local_e8;
  in_RDI[7] = local_e0;
  in_RDI[8] = 0;
  local_b0 = in_RDI;
  local_78 = local_80;
  local_68 = local_70;
  local_58 = local_60;
  local_48 = local_50;
  local_38 = local_40;
  local_28 = local_30;
  local_18 = local_20;
  memset(in_RDI + 9,0,0x40);
  *(undefined1 *)(local_88 + 0xd) = 0;
  *(undefined1 *)((long)local_88 + 0x69) = 0;
  *(undefined1 *)((long)local_88 + 0x6a) = local_91;
  *(undefined1 *)(local_b0 + 0x12) = 0;
  return;
}

Assistant:

void blake3_hasher_init_keyed(blake3_hasher *self,
                              const uint8_t key[BLAKE3_KEY_LEN]) {
  uint32_t key_words[8];
  load_key_words(key, key_words);
  hasher_init_base(self, key_words, KEYED_HASH);
}